

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
diligent_spirv_cross::Compiler::InterfaceVariableAccessHandler::handle
          (InterfaceVariableAccessHandler *this,Op opcode,uint32_t *args,uint32_t length)

{
  int iVar1;
  unordered_set<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>_>
  *puVar2;
  bool bVar3;
  pair<std::__detail::_Node_iterator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_true,_true>,_bool>
  pVar4;
  TypedID<(diligent_spirv_cross::Types)2> local_164;
  SPIRVariable *local_160;
  SPIRVariable *var_7;
  undefined1 local_150;
  TypedID<(diligent_spirv_cross::Types)2> local_144;
  SPIRVariable *local_140;
  SPIRVariable *var_6;
  _Node_iterator_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_true>
  _Stack_130;
  AMDShaderExplicitVertexParameter op_1;
  undefined1 local_128;
  TypedID<(diligent_spirv_cross::Types)2> local_11c;
  SPIRVariable *local_118;
  SPIRVariable *var_5;
  undefined1 local_108;
  TypedID<(diligent_spirv_cross::Types)2> local_fc;
  SPIRVariable *local_f8;
  SPIRVariable *var_4;
  SPIRExtension *pSStack_e8;
  GLSLstd450 op;
  SPIRExtension *extension_set;
  undefined1 local_d8;
  TypedID<(diligent_spirv_cross::Types)2> local_cc;
  _Node_iterator_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_true> local_c8;
  undefined1 local_c0;
  TypedID<(diligent_spirv_cross::Types)2> local_b4;
  SPIRVariable *local_b0;
  SPIRVariable *var_3;
  undefined1 local_a0;
  TypedID<(diligent_spirv_cross::Types)2> local_94;
  SPIRVariable *local_90;
  SPIRVariable *var_2;
  uint32_t i_2;
  uint32_t count_2;
  undefined1 local_78;
  TypedID<(diligent_spirv_cross::Types)2> local_6c;
  SPIRVariable *local_68;
  SPIRVariable *var_1;
  uint32_t i_1;
  uint32_t count_1;
  undefined1 local_50;
  TypedID<(diligent_spirv_cross::Types)2> local_44;
  SPIRVariable *local_40;
  SPIRVariable *var;
  uint32_t i;
  uint32_t count;
  uint32_t variable;
  uint32_t length_local;
  uint32_t *args_local;
  InterfaceVariableAccessHandler *pIStack_18;
  Op opcode_local;
  InterfaceVariableAccessHandler *this_local;
  
  i = 0;
  count = length;
  _variable = args;
  args_local._4_4_ = opcode;
  pIStack_18 = this;
  switch(opcode) {
  case OpExtInst:
    if (length < 3) {
      return false;
    }
    pSStack_e8 = get<diligent_spirv_cross::SPIRExtension>(this->compiler,args[2]);
    iVar1 = *(int *)&(pSStack_e8->super_IVariant).field_0xc;
    if (iVar1 == 1) {
      var_4._4_4_ = _variable[3];
      if ((var_4._4_4_ == 10) || (var_4._4_4_ == 0x23)) {
        local_118 = maybe_get<diligent_spirv_cross::SPIRVariable>(this->compiler,_variable[5]);
        if ((local_118 != (SPIRVariable *)0x0) &&
           (bVar3 = storage_class_is_interface(local_118->storage), bVar3)) {
          puVar2 = this->variables;
          TypedID<(diligent_spirv_cross::Types)2>::TypedID(&local_11c,_variable[5]);
          pVar4 = ::std::
                  unordered_set<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>_>
                  ::insert(puVar2,&local_11c);
          _Stack_130._M_cur =
               (__node_type *)
               pVar4.first.
               super__Node_iterator_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_true>
               ._M_cur;
          local_128 = pVar4.second;
        }
      }
      else if (((var_4._4_4_ - 0x4c < 3) &&
               (local_f8 = maybe_get<diligent_spirv_cross::SPIRVariable>
                                     (this->compiler,_variable[4]), local_f8 != (SPIRVariable *)0x0)
               ) && (bVar3 = storage_class_is_interface(local_f8->storage), bVar3)) {
        puVar2 = this->variables;
        TypedID<(diligent_spirv_cross::Types)2>::TypedID(&local_fc,_variable[4]);
        pVar4 = ::std::
                unordered_set<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>_>
                ::insert(puVar2,&local_fc);
        var_5 = (SPIRVariable *)
                pVar4.first.
                super__Node_iterator_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_true>
                ._M_cur;
        local_108 = pVar4.second;
      }
    }
    else if (((iVar1 == 4) && (var_6._4_4_ = _variable[3], var_6._4_4_ == 1)) &&
            ((local_140 = maybe_get<diligent_spirv_cross::SPIRVariable>(this->compiler,_variable[4])
             , local_140 != (SPIRVariable *)0x0 &&
             (bVar3 = storage_class_is_interface(local_140->storage), bVar3)))) {
      puVar2 = this->variables;
      TypedID<(diligent_spirv_cross::Types)2>::TypedID(&local_144,_variable[4]);
      pVar4 = ::std::
              unordered_set<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>_>
              ::insert(puVar2,&local_144);
      var_7 = (SPIRVariable *)
              pVar4.first.
              super__Node_iterator_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_true>
              ._M_cur;
      local_150 = pVar4.second;
    }
    break;
  default:
    break;
  case OpFunctionCall:
    if (length < 3) {
      return false;
    }
    var._4_4_ = length - 3;
    _variable = args + 3;
    for (var._0_4_ = 0; (uint)var < var._4_4_; var._0_4_ = (uint)var + 1) {
      local_40 = maybe_get<diligent_spirv_cross::SPIRVariable>(this->compiler,_variable[(uint)var]);
      if ((local_40 != (SPIRVariable *)0x0) &&
         (bVar3 = storage_class_is_interface(local_40->storage), bVar3)) {
        puVar2 = this->variables;
        TypedID<(diligent_spirv_cross::Types)2>::TypedID(&local_44,_variable[(uint)var]);
        pVar4 = ::std::
                unordered_set<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>_>
                ::insert(puVar2,&local_44);
        _i_1 = (__node_type *)
               pVar4.first.
               super__Node_iterator_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_true>
               ._M_cur;
        local_50 = pVar4.second;
      }
    }
    break;
  case OpImageTexelPointer:
  case OpLoad:
  case OpAccessChain:
  case OpInBoundsAccessChain:
  case OpPtrAccessChain:
  case OpArrayLength:
  case OpCopyObject:
  case OpAtomicLoad:
  case OpAtomicExchange:
  case OpAtomicCompareExchange:
  case OpAtomicCompareExchangeWeak:
  case OpAtomicIIncrement:
  case OpAtomicIDecrement:
  case OpAtomicIAdd:
  case OpAtomicISub:
  case OpAtomicSMin:
  case OpAtomicUMin:
  case OpAtomicSMax:
  case OpAtomicUMax:
  case OpAtomicAnd:
  case OpAtomicOr:
  case OpAtomicXor:
    if (length < 3) {
      return false;
    }
    i = args[2];
    break;
  case OpStore:
  case OpAtomicStore:
    if (length == 0) {
      return false;
    }
    i = *args;
    break;
  case OpCopyMemory:
    if (length < 2) {
      return false;
    }
    local_b0 = maybe_get<diligent_spirv_cross::SPIRVariable>(this->compiler,*args);
    if ((local_b0 != (SPIRVariable *)0x0) &&
       (bVar3 = storage_class_is_interface(local_b0->storage), bVar3)) {
      puVar2 = this->variables;
      TypedID<(diligent_spirv_cross::Types)2>::TypedID(&local_b4,*_variable);
      pVar4 = ::std::
              unordered_set<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>_>
              ::insert(puVar2,&local_b4);
      local_c8._M_cur =
           (__node_type *)
           pVar4.first.
           super__Node_iterator_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_true>
           ._M_cur;
      local_c0 = pVar4.second;
    }
    local_b0 = maybe_get<diligent_spirv_cross::SPIRVariable>(this->compiler,_variable[1]);
    if ((local_b0 != (SPIRVariable *)0x0) &&
       (bVar3 = storage_class_is_interface(local_b0->storage), bVar3)) {
      puVar2 = this->variables;
      TypedID<(diligent_spirv_cross::Types)2>::TypedID(&local_cc,_variable[1]);
      pVar4 = ::std::
              unordered_set<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>_>
              ::insert(puVar2,&local_cc);
      extension_set =
           (SPIRExtension *)
           pVar4.first.
           super__Node_iterator_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_true>
           ._M_cur;
      local_d8 = pVar4.second;
    }
    break;
  case OpSelect:
    if (length < 5) {
      return false;
    }
    var_1._4_4_ = length - 3;
    _variable = args + 3;
    for (var_1._0_4_ = 0; (uint)var_1 < var_1._4_4_; var_1._0_4_ = (uint)var_1 + 1) {
      local_68 = maybe_get<diligent_spirv_cross::SPIRVariable>
                           (this->compiler,_variable[(uint)var_1]);
      if ((local_68 != (SPIRVariable *)0x0) &&
         (bVar3 = storage_class_is_interface(local_68->storage), bVar3)) {
        puVar2 = this->variables;
        TypedID<(diligent_spirv_cross::Types)2>::TypedID(&local_6c,_variable[(uint)var_1]);
        pVar4 = ::std::
                unordered_set<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>_>
                ::insert(puVar2,&local_6c);
        _i_2 = (__node_type *)
               pVar4.first.
               super__Node_iterator_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_true>
               ._M_cur;
        local_78 = pVar4.second;
      }
    }
    break;
  case OpPhi:
    if (length < 2) {
      return false;
    }
    var_2._4_4_ = length - 2;
    _variable = args + 2;
    for (var_2._0_4_ = 0; (uint)var_2 < var_2._4_4_; var_2._0_4_ = (uint)var_2 + 2) {
      local_90 = maybe_get<diligent_spirv_cross::SPIRVariable>
                           (this->compiler,_variable[(uint)var_2]);
      if ((local_90 != (SPIRVariable *)0x0) &&
         (bVar3 = storage_class_is_interface(local_90->storage), bVar3)) {
        puVar2 = this->variables;
        TypedID<(diligent_spirv_cross::Types)2>::TypedID(&local_94,_variable[(uint)var_2]);
        pVar4 = ::std::
                unordered_set<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>_>
                ::insert(puVar2,&local_94);
        var_3 = (SPIRVariable *)
                pVar4.first.
                super__Node_iterator_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_true>
                ._M_cur;
        local_a0 = pVar4.second;
      }
    }
  }
  if (((i != 0) &&
      (local_160 = maybe_get<diligent_spirv_cross::SPIRVariable>(this->compiler,i),
      local_160 != (SPIRVariable *)0x0)) &&
     (bVar3 = storage_class_is_interface(local_160->storage), bVar3)) {
    puVar2 = this->variables;
    TypedID<(diligent_spirv_cross::Types)2>::TypedID(&local_164,i);
    ::std::
    unordered_set<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>,_std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>_>
    ::insert(puVar2,&local_164);
  }
  return true;
}

Assistant:

bool Compiler::InterfaceVariableAccessHandler::handle(Op opcode, const uint32_t *args, uint32_t length)
{
	uint32_t variable = 0;
	switch (opcode)
	{
	// Need this first, otherwise, GCC complains about unhandled switch statements.
	default:
		break;

	case OpFunctionCall:
	{
		// Invalid SPIR-V.
		if (length < 3)
			return false;

		uint32_t count = length - 3;
		args += 3;
		for (uint32_t i = 0; i < count; i++)
		{
			auto *var = compiler.maybe_get<SPIRVariable>(args[i]);
			if (var && storage_class_is_interface(var->storage))
				variables.insert(args[i]);
		}
		break;
	}

	case OpSelect:
	{
		// Invalid SPIR-V.
		if (length < 5)
			return false;

		uint32_t count = length - 3;
		args += 3;
		for (uint32_t i = 0; i < count; i++)
		{
			auto *var = compiler.maybe_get<SPIRVariable>(args[i]);
			if (var && storage_class_is_interface(var->storage))
				variables.insert(args[i]);
		}
		break;
	}

	case OpPhi:
	{
		// Invalid SPIR-V.
		if (length < 2)
			return false;

		uint32_t count = length - 2;
		args += 2;
		for (uint32_t i = 0; i < count; i += 2)
		{
			auto *var = compiler.maybe_get<SPIRVariable>(args[i]);
			if (var && storage_class_is_interface(var->storage))
				variables.insert(args[i]);
		}
		break;
	}

	case OpAtomicStore:
	case OpStore:
		// Invalid SPIR-V.
		if (length < 1)
			return false;
		variable = args[0];
		break;

	case OpCopyMemory:
	{
		if (length < 2)
			return false;

		auto *var = compiler.maybe_get<SPIRVariable>(args[0]);
		if (var && storage_class_is_interface(var->storage))
			variables.insert(args[0]);

		var = compiler.maybe_get<SPIRVariable>(args[1]);
		if (var && storage_class_is_interface(var->storage))
			variables.insert(args[1]);
		break;
	}

	case OpExtInst:
	{
		if (length < 3)
			return false;
		auto &extension_set = compiler.get<SPIRExtension>(args[2]);
		switch (extension_set.ext)
		{
		case SPIRExtension::GLSL:
		{
			auto op = static_cast<GLSLstd450>(args[3]);

			switch (op)
			{
			case GLSLstd450InterpolateAtCentroid:
			case GLSLstd450InterpolateAtSample:
			case GLSLstd450InterpolateAtOffset:
			{
				auto *var = compiler.maybe_get<SPIRVariable>(args[4]);
				if (var && storage_class_is_interface(var->storage))
					variables.insert(args[4]);
				break;
			}

			case GLSLstd450Modf:
			case GLSLstd450Fract:
			{
				auto *var = compiler.maybe_get<SPIRVariable>(args[5]);
				if (var && storage_class_is_interface(var->storage))
					variables.insert(args[5]);
				break;
			}

			default:
				break;
			}
			break;
		}
		case SPIRExtension::SPV_AMD_shader_explicit_vertex_parameter:
		{
			enum AMDShaderExplicitVertexParameter
			{
				InterpolateAtVertexAMD = 1
			};

			auto op = static_cast<AMDShaderExplicitVertexParameter>(args[3]);

			switch (op)
			{
			case InterpolateAtVertexAMD:
			{
				auto *var = compiler.maybe_get<SPIRVariable>(args[4]);
				if (var && storage_class_is_interface(var->storage))
					variables.insert(args[4]);
				break;
			}

			default:
				break;
			}
			break;
		}
		default:
			break;
		}
		break;
	}

	case OpAccessChain:
	case OpInBoundsAccessChain:
	case OpPtrAccessChain:
	case OpLoad:
	case OpCopyObject:
	case OpImageTexelPointer:
	case OpAtomicLoad:
	case OpAtomicExchange:
	case OpAtomicCompareExchange:
	case OpAtomicCompareExchangeWeak:
	case OpAtomicIIncrement:
	case OpAtomicIDecrement:
	case OpAtomicIAdd:
	case OpAtomicISub:
	case OpAtomicSMin:
	case OpAtomicUMin:
	case OpAtomicSMax:
	case OpAtomicUMax:
	case OpAtomicAnd:
	case OpAtomicOr:
	case OpAtomicXor:
	case OpArrayLength:
		// Invalid SPIR-V.
		if (length < 3)
			return false;
		variable = args[2];
		break;
	}

	if (variable)
	{
		auto *var = compiler.maybe_get<SPIRVariable>(variable);
		if (var && storage_class_is_interface(var->storage))
			variables.insert(variable);
	}
	return true;
}